

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

double __thiscall rapidjson::internal::DiyFp::ToDouble(DiyFp *this)

{
  RapidJSONException *this_00;
  long local_50;
  uint64_t be;
  anon_union_8_2_f9ece1b0 u;
  DiyFp *this_local;
  
  if (0x1fffffffffffff < this->f) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,
               "rapidjson internal assertion failure: f <= kDpHiddenBit + kDpSignificandMask");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  if (this->e < -0x432) {
    this_local = (DiyFp *)0x0;
  }
  else if (this->e < 0x3cc) {
    if ((this->e == -0x432) && ((this->f & 0x10000000000000) == 0)) {
      local_50 = 0;
    }
    else {
      local_50 = (long)(this->e + 0x433);
    }
    this_local = (DiyFp *)(this->f & 0xfffffffffffff | local_50 << 0x34);
  }
  else {
    this_local = (DiyFp *)std::numeric_limits<double>::infinity();
  }
  return (double)this_local;
}

Assistant:

double ToDouble() const {
        union {
            double d;
            uint64_t u64;
        }u;
        CEREAL_RAPIDJSON_ASSERT(f <= kDpHiddenBit + kDpSignificandMask);
        if (e < kDpDenormalExponent) {
            // Underflow.
            return 0.0;
        }
        if (e >= kDpMaxExponent) {
            // Overflow.
            return std::numeric_limits<double>::infinity();
        }
        const uint64_t be = (e == kDpDenormalExponent && (f & kDpHiddenBit) == 0) ? 0 :
            static_cast<uint64_t>(e + kDpExponentBias);
        u.u64 = (f & kDpSignificandMask) | (be << kDpSignificandSize);
        return u.d;
    }